

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module.cpp
# Opt level: O0

uint32_t __thiscall spvtools::opt::Module::GetGlobalValue(Module *this,Op opcode)

{
  bool bVar1;
  Op OVar2;
  uint32_t uVar3;
  Instruction *this_00;
  Instruction *inst;
  const_iterator __end2;
  const_iterator __begin2;
  InstructionList *__range2;
  Op opcode_local;
  Module *this_local;
  
  InstructionList::begin((InstructionList *)&__end2);
  InstructionList::end((InstructionList *)&inst);
  while( true ) {
    bVar1 = utils::operator!=(&__end2,(iterator_template<const_spvtools::opt::Instruction> *)&inst);
    if (!bVar1) {
      return 0;
    }
    this_00 = utils::IntrusiveList<spvtools::opt::Instruction>::
              iterator_template<const_spvtools::opt::Instruction>::operator*(&__end2);
    OVar2 = Instruction::opcode(this_00);
    if (OVar2 == opcode) break;
    utils::IntrusiveList<spvtools::opt::Instruction>::
    iterator_template<const_spvtools::opt::Instruction>::operator++(&__end2);
  }
  uVar3 = Instruction::result_id(this_00);
  return uVar3;
}

Assistant:

uint32_t Module::GetGlobalValue(spv::Op opcode) const {
  for (auto& inst : types_values_) {
    if (inst.opcode() == opcode) return inst.result_id();
  }
  return 0;
}